

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcActor::IfcActor(IfcActor *this,void **vtt)

{
  void *pvVar1;
  
  IfcObject::IfcObject(&this->super_IfcObject,vtt + 1);
  pvVar1 = vtt[0x10];
  *(void **)&(this->super_IfcObject).field_0xd0 = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0xd0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x11];
  *(undefined8 *)&(this->super_IfcObject).field_0xd8 = 0;
  pvVar1 = *vtt;
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0x13];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcObject).field_0xd0 = vtt[0x15];
  *(undefined8 *)&(this->super_IfcObject).field_0xe0 = 0;
  *(undefined8 *)&this->field_0xe8 = 0;
  return;
}

Assistant:

IfcActor() : Object("IfcActor") {}